

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void ImageColorTint(Image *image,Color color)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  Image image_00;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  Color *pCVar9;
  undefined8 in_stack_ffffffffffffffb0;
  int format;
  uchar a;
  uchar b;
  uchar g;
  uchar r;
  int index;
  int x;
  int y;
  float cA;
  float cB;
  float cG;
  float cR;
  Color *pixels;
  Image *image_local;
  Color color_local;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    uVar4 = image->width;
    uVar5 = image->height;
    uVar6 = image->mipmaps;
    uVar7 = image->format;
    image_00.height = uVar7;
    image_00.width = uVar6;
    image_00.data._4_4_ = uVar5;
    image_00.data._0_4_ = uVar4;
    image_00._16_8_ = in_stack_ffffffffffffffb0;
    pCVar9 = LoadImageColors(image_00);
    for (index = 0; index < image->height; index = index + 1) {
      for (_a = 0; _a < image->width; _a = _a + 1) {
        iVar8 = index * image->width + _a;
        bVar1 = pCVar9[iVar8].g;
        bVar2 = pCVar9[iVar8].b;
        bVar3 = pCVar9[iVar8].a;
        pCVar9[index * image->width + _a].r =
             (uchar)(int)(((float)pCVar9[iVar8].r / 255.0) * ((float)((uint)color & 0xff) / 255.0) *
                         255.0);
        pCVar9[index * image->width + _a].g =
             (uchar)(int)(((float)bVar1 / 255.0) * ((float)((uint)color >> 8 & 0xff) / 255.0) *
                         255.0);
        pCVar9[index * image->width + _a].b =
             (uchar)(int)(((float)bVar2 / 255.0) * ((float)((uint)color >> 0x10 & 0xff) / 255.0) *
                         255.0);
        pCVar9[index * image->width + _a].a =
             (uchar)(int)(((float)bVar3 / 255.0) * ((float)((uint)color >> 0x18) / 255.0) * 255.0);
      }
    }
    iVar8 = image->format;
    free(image->data);
    image->data = pCVar9;
    image->format = 7;
    ImageFormat(image,iVar8);
  }
  return;
}

Assistant:

void ImageColorTint(Image *image, Color color)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    Color *pixels = LoadImageColors(*image);

    float cR = (float)color.r/255;
    float cG = (float)color.g/255;
    float cB = (float)color.b/255;
    float cA = (float)color.a/255;

    for (int y = 0; y < image->height; y++)
    {
        for (int x = 0; x < image->width; x++)
        {
            int index = y*image->width + x;
            unsigned char r = (unsigned char)(((float)pixels[index].r/255*cR)*255.0f);
            unsigned char g = (unsigned char)(((float)pixels[index].g/255*cG)*255.0f);
            unsigned char b = (unsigned char)(((float)pixels[index].b/255*cB)*255.0f);
            unsigned char a = (unsigned char)(((float)pixels[index].a/255*cA)*255.0f);

            pixels[y*image->width + x].r = r;
            pixels[y*image->width + x].g = g;
            pixels[y*image->width + x].b = b;
            pixels[y*image->width + x].a = a;
        }
    }

    int format = image->format;
    RL_FREE(image->data);

    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}